

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  value *pvVar2;
  bool *pbVar3;
  undefined8 uVar4;
  uint uVar5;
  char *pcVar6;
  service srv;
  service local_70 [8];
  undefined1 local_68 [16];
  code *local_58;
  code *pcStack_50;
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  cppcms::service::service(local_70,argc,argv);
  pvVar2 = (value *)cppcms::service::settings();
  cppcms::json::value::get_abi_cxx11_((string *)local_68,pvVar2,"test.async","sync");
  iVar1 = std::__cxx11::string::compare(local_68);
  if ((function *)local_68._0_8_ != (function *)&local_58) {
    operator_delete((void *)local_68._0_8_);
  }
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Synchronous testing",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    uVar4 = cppcms::service::applications_pool();
    cppcms::create_pool<unit_test>();
    cppcms::applications_pool::mount(uVar4,local_30,0);
    local_38 = local_28;
  }
  else {
    pvVar2 = (value *)cppcms::service::settings();
    cppcms::json::value::get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,pvVar2,
               "test.async");
    iVar1 = std::__cxx11::string::compare(local_68);
    if ((function *)local_68._0_8_ != (function *)&local_58) {
      operator_delete((void *)local_68._0_8_);
    }
    if (iVar1 == 0) {
      pcVar6 = "Asynchronous testing";
      pbVar3 = &is_async;
    }
    else {
      pvVar2 = (value *)cppcms::service::settings();
      cppcms::json::value::get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 pvVar2,"test.async");
      iVar1 = std::__cxx11::string::compare(local_68);
      if ((function *)local_68._0_8_ != (function *)&local_58) {
        operator_delete((void *)local_68._0_8_);
      }
      if (iVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Invalid configuration value of test.async",0x29);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
        std::ostream::put('8');
        uVar5 = 1;
        std::ostream::flush();
        goto LAB_00105809;
      }
      is_async = true;
      pcVar6 = "Non blocking testing";
      pbVar3 = &is_nonblocking;
    }
    *pbVar3 = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    uVar4 = cppcms::service::applications_pool();
    cppcms::create_pool<unit_test>();
    cppcms::applications_pool::mount(uVar4,local_40,1);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  local_68._8_8_ = 0;
  pcStack_50 = std::_Function_handler<void_(),_submitter>::_M_invoke;
  local_58 = std::_Function_handler<void_(),_submitter>::_M_manager;
  local_68._0_8_ = (function *)local_70;
  cppcms::service::after_fork((function *)local_70);
  if (local_58 != (code *)0x0) {
    (*local_58)(local_68,local_68,3);
  }
  uVar5 = 0;
  cppcms::service::run();
LAB_00105809:
  cppcms::service::~service(local_70);
  if (uVar5 == 0) {
    uVar5 = run_ok ^ 1;
  }
  return uVar5;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		if(srv.settings().get("test.async","sync")=="sync") {
			std::cout << "Synchronous testing" << std::endl;
			srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		}
		else {
			if(srv.settings().get<std::string>("test.async")=="async") {
				is_async = true;
				std::cout << "Asynchronous testing" << std::endl;
			}
			else if(srv.settings().get<std::string>("test.async")=="nonblocking") {
				is_async = true;
				is_nonblocking = true;
				std::cout << "Non blocking testing" << std::endl;
			}
			else {
				std::cerr << "Invalid configuration value of test.async" << std::endl;
				return 1;
			}
			srv.applications_pool().mount( cppcms::create_pool<unit_test>(),cppcms::app::asynchronous);
		}
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	return run_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}